

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

RegExp * __thiscall re2c::Scanner::mkDefault(Scanner *this)

{
  uint32_t u;
  opt_t *poVar1;
  Range *m;
  MatchOp *this_00;
  Range *def;
  Scanner *this_local;
  
  poVar1 = Opt::operator->((Opt *)&opts);
  u = Enc::nCodeUnits(&poVar1->encoding);
  m = Range::ran(0,u);
  this_00 = (MatchOp *)operator_new(0x10);
  MatchOp::MatchOp(this_00,m);
  return &this_00->super_RegExp;
}

Assistant:

RegExp * Scanner::mkDefault() const
{
	Range * def = Range::ran (0, opts->encoding.nCodeUnits());
	return new MatchOp(def);
}